

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int get_nonce_hash(uchar *pub_key,size_t pub_key_len,uchar *priv_key,size_t priv_key_len,
                  uchar *bytes_out,size_t len)

{
  int local_5c;
  uchar local_58 [4];
  int ret;
  uchar nonce [32];
  size_t len_local;
  uchar *bytes_out_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  nonce._24_8_ = len;
  local_5c = wally_ecdh(pub_key,pub_key_len,priv_key,priv_key_len,local_58,0x20);
  if (local_5c == 0) {
    local_5c = wally_sha256(local_58,0x20,bytes_out,nonce._24_8_);
  }
  wally_clear(local_58,0x20);
  return local_5c;
}

Assistant:

static int get_nonce_hash(const unsigned char *pub_key, size_t pub_key_len,
                          const unsigned char *priv_key, size_t priv_key_len,
                          unsigned char *bytes_out, size_t len)
{
    unsigned char nonce[SHA256_LEN];
    int ret;

    ret = wally_ecdh(pub_key, pub_key_len, priv_key, priv_key_len,
                     nonce, sizeof(nonce));
    if (ret == WALLY_OK)
        ret = wally_sha256(nonce, sizeof(nonce), bytes_out, len);
    wally_clear(nonce, sizeof(nonce));
    return ret;
}